

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O3

void __thiscall Pl_SHA2::finish(Pl_SHA2 *this)

{
  Pipeline *pPVar1;
  
  pPVar1 = (this->super_Pipeline).next_;
  if (pPVar1 != (Pipeline *)0x0) {
    (*pPVar1->_vptr_Pipeline[3])();
  }
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[9])();
  this->in_progress = false;
  return;
}

Assistant:

void
Pl_SHA2::finish()
{
    if (next()) {
        next()->finish();
    }
    this->crypto->SHA2_finalize();
    this->in_progress = false;
}